

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::ConditionalBranchDirectiveSyntax::isKind(SyntaxKind kind)

{
  return (bool)((byte)(0xa000000000000001 >> ((byte)(kind - ElsIfDirective) & 0x3f)) &
               kind - ElsIfDirective < 0x40);
}

Assistant:

bool ConditionalBranchDirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ElsIfDirective:
        case SyntaxKind::IfDefDirective:
        case SyntaxKind::IfNDefDirective:
            return true;
        default:
            return false;
    }
}